

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peerman_tests.cpp
# Opt level: O1

void peerman_tests::mineBlock(NodeContext *node,seconds block_time)

{
  undefined8 uVar1;
  ChainstateManager *this;
  uint256 hash;
  undefined8 uVar2;
  bool bVar3;
  time_point tVar4;
  Chainstate *chainstate;
  long lVar5;
  __uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> _Var6;
  CBlock *pCVar7;
  long in_FS_OFFSET;
  byte bVar8;
  Options options;
  CBlock block;
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [40];
  _Hashtable<transaction_identifier<false>,_transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>,_std::__detail::_Identity,_std::equal_to<transaction_identifier<false>_>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_1b8 [2];
  Options local_118;
  uint256 local_e8;
  undefined1 local_c8 [28];
  uint uStack_ac;
  CBlock local_a0;
  long local_30;
  
  bVar8 = 0;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  tVar4 = NodeClock::now();
  SetMockTime(block_time);
  local_118.super_BlockCreateOptions.use_mempool = true;
  local_118.super_BlockCreateOptions.coinbase_max_additional_weight = 4000;
  local_118.super_BlockCreateOptions.coinbase_output_max_additional_sigops = 400;
  local_118.nBlockMaxWeight = 0x3cf960;
  local_118.blockMinFeeRate.nSatoshisPerK = 1000;
  local_118.test_block_validity = true;
  local_118.print_modified_fee = false;
  chainstate = ChainstateManager::ActiveChainstate
                         ((node->chainman)._M_t.
                          super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                          .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ::node::BlockAssembler::BlockAssembler
            ((BlockAssembler *)local_1e0,chainstate,(CTxMemPool *)0x0,&local_118);
  local_c8._16_8_ = 0;
  stack0xffffffffffffff50 = 0;
  local_c8._0_8_ = (char *)0x0;
  local_c8._8_8_ = 0;
  local_1f0[0xf] = 0x51;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_c8,(iterator)local_c8,
             local_1f0 + 0xf);
  ::node::BlockAssembler::CreateNewBlock((BlockAssembler *)local_1f0,(CScript *)local_1e0);
  uVar2 = local_1f0._0_8_;
  _Var6._M_t.
  super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
  super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl =
       (tuple<node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>)
       (tuple<node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>)local_1f0._0_8_;
  pCVar7 = &local_a0;
  for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
    uVar1 = *(undefined8 *)
             _Var6._M_t.
             super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
             .super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl;
    (pCVar7->super_CBlockHeader).nVersion = (int)uVar1;
    (pCVar7->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] =
         (char)((ulong)uVar1 >> 0x20);
    (pCVar7->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] =
         (char)((ulong)uVar1 >> 0x28);
    (pCVar7->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] =
         (char)((ulong)uVar1 >> 0x30);
    (pCVar7->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] =
         (char)((ulong)uVar1 >> 0x38);
    _Var6._M_t.
    super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
    super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl =
         (tuple<node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>)
         (tuple<node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>)
         ((long)((long)_Var6._M_t.
                       super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
                       .super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl + 8) +
         (ulong)bVar8 * -0x10);
    pCVar7 = (CBlock *)((long)pCVar7 + ((ulong)bVar8 * -2 + 1) * 8);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(&local_a0.vtx,
           (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)(local_1f0._0_8_ + 0x50));
  local_a0.m_checked_merkle_root = *(bool *)(uVar2 + 0x6a);
  local_a0._104_2_ = *(undefined2 *)(uVar2 + 0x68);
  if ((_Head_base<0UL,_node::CBlockTemplate_*,_false>)local_1f0._0_8_ !=
      (_Head_base<0UL,_node::CBlockTemplate_*,_false>)0x0) {
    std::default_delete<node::CBlockTemplate>::operator()
              ((default_delete<node::CBlockTemplate> *)local_1f0,(CBlockTemplate *)local_1f0._0_8_);
  }
  local_1f0._0_8_ = (CBlockTemplate *)0x0;
  if (0x1c < uStack_ac) {
    free((void *)local_c8._0_8_);
    local_c8._0_8_ = (char *)0x0;
  }
  std::
  _Hashtable<transaction_identifier<false>,_transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>,_std::__detail::_Identity,_std::equal_to<transaction_identifier<false>_>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_1b8);
  if ((CBlockTemplate *)local_1e0._0_8_ != (CBlockTemplate *)0x0) {
    std::default_delete<node::CBlockTemplate>::operator()
              ((default_delete<node::CBlockTemplate> *)local_1e0,(CBlockTemplate *)local_1e0._0_8_);
  }
  while( true ) {
    CBlockHeader::GetHash(&local_e8,&local_a0.super_CBlockHeader);
    hash.super_base_blob<256U>.m_data._M_elems[8] =
         local_e8.super_base_blob<256U>.m_data._M_elems[8];
    hash.super_base_blob<256U>.m_data._M_elems[9] =
         local_e8.super_base_blob<256U>.m_data._M_elems[9];
    hash.super_base_blob<256U>.m_data._M_elems[10] =
         local_e8.super_base_blob<256U>.m_data._M_elems[10];
    hash.super_base_blob<256U>.m_data._M_elems[0xb] =
         local_e8.super_base_blob<256U>.m_data._M_elems[0xb];
    hash.super_base_blob<256U>.m_data._M_elems[0xc] =
         local_e8.super_base_blob<256U>.m_data._M_elems[0xc];
    hash.super_base_blob<256U>.m_data._M_elems[0xd] =
         local_e8.super_base_blob<256U>.m_data._M_elems[0xd];
    hash.super_base_blob<256U>.m_data._M_elems[0xe] =
         local_e8.super_base_blob<256U>.m_data._M_elems[0xe];
    hash.super_base_blob<256U>.m_data._M_elems[0xf] =
         local_e8.super_base_blob<256U>.m_data._M_elems[0xf];
    hash.super_base_blob<256U>.m_data._M_elems[0] =
         local_e8.super_base_blob<256U>.m_data._M_elems[0];
    hash.super_base_blob<256U>.m_data._M_elems[1] =
         local_e8.super_base_blob<256U>.m_data._M_elems[1];
    hash.super_base_blob<256U>.m_data._M_elems[2] =
         local_e8.super_base_blob<256U>.m_data._M_elems[2];
    hash.super_base_blob<256U>.m_data._M_elems[3] =
         local_e8.super_base_blob<256U>.m_data._M_elems[3];
    hash.super_base_blob<256U>.m_data._M_elems[4] =
         local_e8.super_base_blob<256U>.m_data._M_elems[4];
    hash.super_base_blob<256U>.m_data._M_elems[5] =
         local_e8.super_base_blob<256U>.m_data._M_elems[5];
    hash.super_base_blob<256U>.m_data._M_elems[6] =
         local_e8.super_base_blob<256U>.m_data._M_elems[6];
    hash.super_base_blob<256U>.m_data._M_elems[7] =
         local_e8.super_base_blob<256U>.m_data._M_elems[7];
    hash.super_base_blob<256U>.m_data._M_elems[0x10] =
         local_e8.super_base_blob<256U>.m_data._M_elems[0x10];
    hash.super_base_blob<256U>.m_data._M_elems[0x11] =
         local_e8.super_base_blob<256U>.m_data._M_elems[0x11];
    hash.super_base_blob<256U>.m_data._M_elems[0x12] =
         local_e8.super_base_blob<256U>.m_data._M_elems[0x12];
    hash.super_base_blob<256U>.m_data._M_elems[0x13] =
         local_e8.super_base_blob<256U>.m_data._M_elems[0x13];
    hash.super_base_blob<256U>.m_data._M_elems[0x14] =
         local_e8.super_base_blob<256U>.m_data._M_elems[0x14];
    hash.super_base_blob<256U>.m_data._M_elems[0x15] =
         local_e8.super_base_blob<256U>.m_data._M_elems[0x15];
    hash.super_base_blob<256U>.m_data._M_elems[0x16] =
         local_e8.super_base_blob<256U>.m_data._M_elems[0x16];
    hash.super_base_blob<256U>.m_data._M_elems[0x17] =
         local_e8.super_base_blob<256U>.m_data._M_elems[0x17];
    hash.super_base_blob<256U>.m_data._M_elems[0x18] =
         local_e8.super_base_blob<256U>.m_data._M_elems[0x18];
    hash.super_base_blob<256U>.m_data._M_elems[0x19] =
         local_e8.super_base_blob<256U>.m_data._M_elems[0x19];
    hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
         local_e8.super_base_blob<256U>.m_data._M_elems[0x1a];
    hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
         local_e8.super_base_blob<256U>.m_data._M_elems[0x1b];
    hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
         local_e8.super_base_blob<256U>.m_data._M_elems[0x1c];
    hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
         local_e8.super_base_blob<256U>.m_data._M_elems[0x1d];
    hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
         local_e8.super_base_blob<256U>.m_data._M_elems[0x1e];
    hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
         local_e8.super_base_blob<256U>.m_data._M_elems[0x1f];
    bVar3 = CheckProofOfWork(hash,local_a0.super_CBlockHeader.nBits,
                             &((((node->chainman)._M_t.
                                 super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                                 .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->
                               m_options).chainparams)->consensus);
    if (bVar3) break;
    local_a0.super_CBlockHeader.nNonce = local_a0.super_CBlockHeader.nNonce + 1;
  }
  local_a0.fChecked = true;
  SetMockTime((seconds)((long)tVar4.__d.__r / 1000000000));
  this = (node->chainman)._M_t.
         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
         super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl;
  local_1e0._0_8_ =
       (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CBlock_const,std::allocator<CBlock>,CBlock&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1e0 + 8),(CBlock **)local_1e0,
             (allocator<CBlock> *)local_c8,&local_a0);
  bVar3 = ChainstateManager::ProcessNewBlock
                    (this,(shared_ptr<const_CBlock> *)local_1e0,true,true,(bool *)0x0);
  local_1f0[0] = bVar3;
  inline_assertion_check<true,bool>
            ((bool *)local_1f0,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/peerman_tests.cpp"
             ,0x1c,"mineBlock",
             "node.chainman->ProcessNewBlock(std::make_shared<const CBlock>(block), true, true, nullptr)"
            );
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._8_8_);
  }
  ValidationSignals::SyncWithValidationInterfaceQueue
            ((node->validation_signals)._M_t.
             super___uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_>._M_t.
             super__Tuple_impl<0UL,_ValidationSignals_*,_std::default_delete<ValidationSignals>_>.
             super__Head_base<0UL,_ValidationSignals_*,_false>._M_head_impl);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&local_a0.vtx);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void mineBlock(const node::NodeContext& node, std::chrono::seconds block_time)
{
    auto curr_time = GetTime<std::chrono::seconds>();
    SetMockTime(block_time); // update time so the block is created with it
    node::BlockAssembler::Options options;
    CBlock block = node::BlockAssembler{node.chainman->ActiveChainstate(), nullptr, options}.CreateNewBlock(CScript() << OP_TRUE)->block;
    while (!CheckProofOfWork(block.GetHash(), block.nBits, node.chainman->GetConsensus())) ++block.nNonce;
    block.fChecked = true; // little speedup
    SetMockTime(curr_time); // process block at current time
    Assert(node.chainman->ProcessNewBlock(std::make_shared<const CBlock>(block), /*force_processing=*/true, /*min_pow_checked=*/true, nullptr));
    node.validation_signals->SyncWithValidationInterfaceQueue(); // drain events queue
}